

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c.cc
# Opt level: O2

char * leveldb_env_get_test_directory(leveldb_env_t *env)

{
  size_t __n;
  char *__dest;
  string result;
  undefined1 *local_38;
  size_t local_30;
  undefined1 local_28 [16];
  Status local_18;
  
  local_38 = local_28;
  local_30 = 0;
  local_28[0] = 0;
  (*env->rep->_vptr_Env[0x13])(&local_18,env->rep,&local_38);
  leveldb::Status::~Status(&local_18);
  __n = local_30;
  if (local_18.state_ == (char *)0x0) {
    __dest = (char *)malloc(local_30 + 1);
    memcpy(__dest,local_38,__n);
    __dest[__n] = '\0';
  }
  else {
    __dest = (char *)0x0;
  }
  std::__cxx11::string::_M_dispose();
  return __dest;
}

Assistant:

char* leveldb_env_get_test_directory(leveldb_env_t* env) {
  std::string result;
  if (!env->rep->GetTestDirectory(&result).ok()) {
    return nullptr;
  }

  char* buffer = static_cast<char*>(malloc(result.size() + 1));
  std::memcpy(buffer, result.data(), result.size());
  buffer[result.size()] = '\0';
  return buffer;
}